

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_symlink(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,int flags,uv_fs_cb cb)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t new_path_len;
  size_t path_len;
  uv_fs_cb cb_local;
  int flags_local;
  char *new_path_local;
  char *path_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (req == (uv_fs_t *)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->loop = loop;
    req->type = UV_FS;
    req->fs_type = UV_FS_SYMLINK;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
      req->new_path = new_path;
    }
    else {
      sVar2 = strlen(path);
      sVar2 = sVar2 + 1;
      sVar3 = strlen(new_path);
      pcVar4 = (char *)uv__malloc(sVar2 + sVar3 + 1);
      req->path = pcVar4;
      if (req->path == (char *)0x0) {
        return -0xc;
      }
      req->new_path = req->path + sVar2;
      memcpy(req->path,path,sVar2);
      memcpy(req->new_path,new_path,sVar3 + 1);
    }
    req->flags = flags;
    if ((cb == (uv_fs_cb)0x0) || (iVar1 = uv__iou_fs_symlink(loop,req), iVar1 == 0)) {
      if (cb == (uv_fs_cb)0x0) {
        uv__fs_work(&req->work_req);
        loop_local._4_4_ = (int)req->result;
      }
      else {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
        loop_local._4_4_ = 0;
      }
    }
    else {
      loop_local._4_4_ = 0;
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_symlink(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  const char* new_path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(SYMLINK);
  PATH2;
  req->flags = flags;
  if (cb != NULL)
    if (uv__iou_fs_symlink(loop, req))
      return 0;
  POST;
}